

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::MatchSetInst<false>::Exec
          (MatchSetInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  bool bVar1;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  MatchSetInst<false> *this_local;
  
  Matcher::CompStats(matcher);
  if ((*inputOffset < inputLength) &&
     (bVar1 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[*inputOffset]),
     bVar1)) {
    *inputOffset = *inputOffset + 1;
    *instPointer = *instPointer + 0x29;
    return false;
  }
  bVar1 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  return bVar1;
}

Assistant:

inline bool MatchSetInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if (inputOffset >= inputLength || this->set.Get(input[inputOffset]) == IsNegation)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        inputOffset++;
        instPointer += sizeof(*this);
        return false;
    }